

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifyInlinableBlocks.cpp
# Opt level: O1

void identifyInlinableBlocks(Module *module,Program *program)

{
  Module *pMVar1;
  pointer ppEVar2;
  bool bVar3;
  Func *this;
  Block *pBVar4;
  long lVar5;
  BasicBlock *pBVar6;
  Module *f;
  Function *pFVar7;
  
  for (pMVar1 = *(Module **)(module + 0x20); pMVar1 != module + 0x18;
      pMVar1 = *(Module **)(pMVar1 + 8)) {
    f = pMVar1 + -0x38;
    if (pMVar1 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    this = Program::getFunction(program,(Function *)f);
    for (pFVar7 = *(Function **)((Function *)f + 0x50); pFVar7 != (Function *)f + 0x48;
        pFVar7 = *(Function **)(pFVar7 + 8)) {
      pBVar6 = (BasicBlock *)(pFVar7 + -0x18);
      if (pFVar7 == (Function *)0x0) {
        pBVar6 = (BasicBlock *)0x0;
      }
      pBVar4 = Func::createBlockIfNotExist(this,pBVar6);
      lVar5 = llvm::BasicBlock::getSinglePredecessor();
      bVar3 = true;
      if (lVar5 == 0) {
        ppEVar2 = (pBVar4->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)(pBVar4->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppEVar2 == 8) {
          bVar3 = RetExpr::classof(*ppEVar2);
        }
        else {
          bVar3 = false;
        }
      }
      pBVar4->doInline = bVar3;
    }
    pFVar7 = *(Function **)((Function *)f + 0x50);
    if (pFVar7 != (Function *)f + 0x48) {
      pBVar6 = (BasicBlock *)(pFVar7 + -0x18);
      if (pFVar7 == (Function *)0x0) {
        pBVar6 = (BasicBlock *)0x0;
      }
      pBVar4 = Func::createBlockIfNotExist(this,pBVar6);
      pBVar4->doInline = false;
      pBVar4->isFirst = true;
    }
  }
  Program::addPass(program,IdentifyInlinableBlocks);
  return;
}

Assistant:

void identifyInlinableBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    assert(program.isPassCompleted(PassType::ParseBreaks));

    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            myBlock->doInline = isSafeToInline(&block, myBlock);
        }

        if (func.begin() == func.end())
            continue;

        // first block is only inlinable if there are no predecessors
        auto& firstBlock = *func.begin();
        auto* myBlock = function->createBlockIfNotExist(&firstBlock);

        myBlock->doInline = false;
        myBlock->isFirst = true;
    }

    program.addPass(PassType::IdentifyInlinableBlocks);
}